

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

UniValue * __thiscall UniValue::find_value(UniValue *this,string_view key)

{
  long lVar1;
  pointer pbVar2;
  ulong uVar3;
  bool bVar4;
  const_reference pvVar5;
  ulong __n;
  long in_FS_OFFSET;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  do {
    __n = uVar3;
    pbVar2 = (this->keys).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->keys).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= __n) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return &NullUniValue;
      }
      goto LAB_0010dccd;
    }
    __y._M_str = pbVar2[__n]._M_dataplus._M_p;
    __y._M_len = pbVar2[__n]._M_string_length;
    bVar4 = std::operator==(key,__y);
    uVar3 = (ulong)((int)__n + 1);
  } while (!bVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pvVar5 = std::vector<UniValue,_std::allocator<UniValue>_>::at(&this->values,__n);
    return pvVar5;
  }
LAB_0010dccd:
  __stack_chk_fail();
}

Assistant:

const UniValue& UniValue::find_value(std::string_view key) const
{
    for (unsigned int i = 0; i < keys.size(); ++i) {
        if (keys[i] == key) {
            return values.at(i);
        }
    }
    return NullUniValue;
}